

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QList<unsigned_int> *
qt_convert_to_ucs4(QList<unsigned_int> *__return_storage_ptr__,QStringView string)

{
  char32_t cVar1;
  const_iterator pQVar2;
  char32_t *pcVar3;
  char32_t *pcVar4;
  long in_FS_OFFSET;
  QStringIterator local_48;
  long local_30;
  
  pQVar2 = (const_iterator)string.m_data;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (uint *)&DAT_aaaaaaaaaaaaaaaa;
  QList<unsigned_int>::QList(__return_storage_ptr__,string.m_size);
  pcVar3 = (char32_t *)(__return_storage_ptr__->d).ptr;
  local_48.e = pQVar2 + string.m_size;
  pcVar4 = pcVar3;
  local_48.i = pQVar2;
  local_48.pos = pQVar2;
  while (local_48.pos < local_48.e) {
    cVar1 = QStringIterator::next(&local_48,L'�');
    *pcVar3 = cVar1;
    pcVar3 = pcVar3 + 1;
    pcVar4 = pcVar4 + 1;
  }
  QList<unsigned_int>::resize
            (__return_storage_ptr__,(long)pcVar4 - (long)(__return_storage_ptr__->d).ptr >> 2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static QList<uint> qt_convert_to_ucs4(QStringView string)
{
    QList<uint> v(string.size());
    uint *a = const_cast<uint*>(v.constData());
    QStringIterator it(string);
    while (it.hasNext())
        *a++ = it.next();
    v.resize(a - v.constData());
    return v;
}